

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O0

void Unr_ManSetup(Unr_Man_t *p,int fVerbose)

{
  Vec_Int_t *pVVar1;
  Gia_Man_t *p_00;
  Unr_Obj_t *pUVar2;
  Unr_Man_t *pUVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  abctime aVar9;
  int *piVar10;
  Unr_Obj_t *pUVar11;
  Gia_Obj_t *pObj_00;
  abctime aVar12;
  bool bVar13;
  int End;
  int Beg;
  Vec_Int_t *t_1;
  abctime clk;
  int *pInts;
  int nInts;
  int iObj;
  int t;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Unr_Obj_t *pUnrObj;
  Vec_Int_t *vMap;
  Vec_Int_t *vRoots2;
  Vec_Int_t *vRoots;
  Unr_Man_t *pUStack_10;
  int fVerbose_local;
  Unr_Man_t *p_local;
  
  vRoots._4_4_ = fVerbose;
  pUStack_10 = p;
  aVar9 = Abc_Clock();
  iVar4 = Vec_IntSize(pUStack_10->vOrder);
  if (iVar4 != 0) {
    __assert_fail("Vec_IntSize(p->vOrder) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcUnroll.c"
                  ,0xc2,"void Unr_ManSetup(Unr_Man_t *, int)");
  }
  Vec_IntPush(pUStack_10->vOrder,0);
  pVVar1 = pUStack_10->vOrderLim;
  iVar4 = Vec_IntSize(pUStack_10->vOrder);
  Vec_IntPush(pVVar1,iVar4);
  Vec_IntWriteEntry(pUStack_10->vTents,0,0);
  Vec_IntWriteEntry(pUStack_10->vRanks,0,0);
  vRoots2 = Vec_IntAlloc(100);
  vMap = Vec_IntAlloc(100);
  t = 0;
  while( true ) {
    iVar4 = Gia_ManPoNum(pUStack_10->pGia);
    bVar13 = false;
    if (t < iVar4) {
      _k = Gia_ManCo(pUStack_10->pGia,t);
      bVar13 = _k != (Gia_Obj_t *)0x0;
    }
    pUVar3 = pUStack_10;
    if (!bVar13) break;
    iVar4 = Gia_ObjId(pUStack_10->pGia,_k);
    Unr_ManSetup_rec(pUVar3,iVar4,0,vRoots2);
    t = t + 1;
  }
  while (iVar4 = Vec_IntSize(vRoots2), 0 < iVar4) {
    pVVar1 = pUStack_10->vOrderLim;
    iVar4 = Vec_IntSize(pUStack_10->vOrder);
    Vec_IntPush(pVVar1,iVar4);
    Vec_IntClear(vMap);
    for (t = 0; iVar4 = Vec_IntSize(vRoots2), t < iVar4; t = t + 1) {
      iVar4 = Vec_IntEntry(vRoots2,t);
      pUVar3 = pUStack_10;
      iVar5 = Vec_IntSize(pUStack_10->vOrderLim);
      Unr_ManSetup_rec(pUVar3,iVar4,iVar5 + -1,vMap);
    }
    pVVar1 = vMap;
    vMap = vRoots2;
    vRoots2 = pVVar1;
  }
  pVVar1 = pUStack_10->vOrderLim;
  iVar4 = Vec_IntSize(pUStack_10->vOrder);
  Vec_IntPush(pVVar1,iVar4);
  Vec_IntFree(vRoots2);
  Vec_IntFree(vMap);
  pInts._4_4_ = 0;
  for (t = 0; iVar4 = Vec_IntSize(pUStack_10->vOrder), t < iVar4; t = t + 1) {
    iVar4 = Vec_IntEntry(pUStack_10->vOrder,t);
    iVar4 = Vec_IntEntry(pUStack_10->vRanks,iVar4);
    iVar4 = Unr_ObjSizeInt(iVar4 + 1);
    pInts._4_4_ = iVar4 + pInts._4_4_;
  }
  piVar10 = (int *)calloc((long)pInts._4_4_,4);
  pUStack_10->pObjs = piVar10;
  pUStack_10->pEnd = pUStack_10->pObjs + pInts._4_4_;
  pUVar11 = Unr_ManObj(pUStack_10,(int)((long)piVar10 - (long)pUStack_10->pObjs >> 2));
  iVar4 = Vec_IntEntry(pUStack_10->vRanks,0);
  *(ulong *)&pUVar11->field_0x8 =
       *(ulong *)&pUVar11->field_0x8 & 0xfffe0003ffffffff | ((ulong)(iVar4 + 1) & 0x7fff) << 0x22;
  *(ulong *)&pUVar11->field_0x8 = *(ulong *)&pUVar11->field_0x8 & 0xffffffff0001ffff | 0xfffe0000;
  *(ulong *)&pUVar11->field_0x8 = *(ulong *)&pUVar11->field_0x8 & 0xfffffffffffe0003 | 0x1fffc;
  pUVar11->Res[0] = 0;
  pUnrObj = (Unr_Obj_t *)Vec_IntStartFull(pUStack_10->nObjs);
  Vec_IntWriteEntry((Vec_Int_t *)pUnrObj,0,(int)((long)piVar10 - (long)pUStack_10->pObjs >> 2));
  iVar4 = Unr_ObjSize(pUVar11);
  clk = (abctime)(piVar10 + iVar4);
  iVar4 = Vec_IntSize(pUStack_10->vObjLim);
  if (iVar4 != 0) {
    __assert_fail("Vec_IntSize(p->vObjLim) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcUnroll.c"
                  ,0xe8,"void Unr_ManSetup(Unr_Man_t *, int)");
  }
  iVar4 = Vec_IntSize(pUStack_10->vOrderLim);
  nInts = iVar4 + -2;
  do {
    if (nInts < 0) {
      if (clk - (long)pUStack_10->pObjs >> 2 != (long)pInts._4_4_) {
        __assert_fail("pInts - p->pObjs == nInts",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcUnroll.c"
                      ,0x103,"void Unr_ManSetup(Unr_Man_t *, int)");
      }
      t = 0;
      while( true ) {
        bVar13 = false;
        if (t < pUStack_10->pGia->nObjs) {
          _k = Gia_ManObj(pUStack_10->pGia,t);
          bVar13 = _k != (Gia_Obj_t *)0x0;
        }
        if (!bVar13) break;
        iVar4 = Vec_IntEntry((Vec_Int_t *)pUnrObj,t);
        pUVar3 = pUStack_10;
        if (iVar4 != -1) {
          iVar4 = Vec_IntEntry((Vec_Int_t *)pUnrObj,t);
          pUVar11 = Unr_ManObj(pUVar3,iVar4);
          iVar4 = Gia_ObjIsAnd(_k);
          if ((iVar4 != 0) || (iVar4 = Gia_ObjIsCo(_k), iVar4 != 0)) {
            pUVar2 = pUnrObj;
            iVar4 = Gia_ObjFaninId0(_k,t);
            uVar6 = Vec_IntEntry((Vec_Int_t *)pUVar2,iVar4);
            pUVar11->hFan0 = uVar6;
            uVar6 = Gia_ObjFaninC0(_k);
            *(ulong *)&pUVar11->field_0x8 =
                 *(ulong *)&pUVar11->field_0x8 & 0xfffffffffffffffe | (ulong)uVar6 & 1;
            uVar6 = Gia_ObjIsPo(pUStack_10->pGia,_k);
            *(ulong *)&pUVar11->field_0x8 =
                 *(ulong *)&pUVar11->field_0x8 & 0xfffffffdffffffff | ((ulong)uVar6 & 1) << 0x21;
          }
          iVar4 = Gia_ObjIsAnd(_k);
          pUVar2 = pUnrObj;
          if (iVar4 == 0) {
            iVar4 = Gia_ObjIsRo(pUStack_10->pGia,_k);
            pUVar2 = pUnrObj;
            if (iVar4 == 0) {
              iVar4 = Gia_ObjIsPi(pUStack_10->pGia,_k);
              if (iVar4 != 0) {
                uVar6 = Gia_ObjCioId(_k);
                pUVar11->hFan0 = uVar6;
                uVar6 = Vec_IntEntry(pUStack_10->vTents,t);
                pUVar11->hFan1 = uVar6;
                *(ulong *)&pUVar11->field_0x8 =
                     *(ulong *)&pUVar11->field_0x8 & 0xfffffffeffffffff | 0x100000000;
              }
            }
            else {
              p_00 = pUStack_10->pGia;
              pObj_00 = Gia_ObjRoToRi(pUStack_10->pGia,_k);
              iVar4 = Gia_ObjId(p_00,pObj_00);
              uVar6 = Vec_IntEntry((Vec_Int_t *)pUVar2,iVar4);
              pUVar11->hFan0 = uVar6;
              *(ulong *)&pUVar11->field_0x8 = *(ulong *)&pUVar11->field_0x8 & 0xfffffffffffffffe;
            }
          }
          else {
            iVar4 = Gia_ObjFaninId1(_k,t);
            uVar6 = Vec_IntEntry((Vec_Int_t *)pUVar2,iVar4);
            pUVar11->hFan1 = uVar6;
            uVar6 = Gia_ObjFaninC1(_k);
            *(ulong *)&pUVar11->field_0x8 =
                 *(ulong *)&pUVar11->field_0x8 & 0xfffffffffffffffd | ((ulong)uVar6 & 1) << 1;
          }
        }
        t = t + 1;
      }
      t = 0;
      while( true ) {
        iVar4 = Vec_IntSize(pUStack_10->pGia->vCis);
        bVar13 = false;
        if (t < iVar4) {
          _k = Gia_ManCi(pUStack_10->pGia,t);
          bVar13 = _k != (Gia_Obj_t *)0x0;
        }
        pUVar11 = pUnrObj;
        if (!bVar13) break;
        pVVar1 = pUStack_10->vCiMap;
        iVar4 = Gia_ObjId(pUStack_10->pGia,_k);
        iVar4 = Vec_IntEntry((Vec_Int_t *)pUVar11,iVar4);
        Vec_IntPush(pVVar1,iVar4);
        t = t + 1;
      }
      t = 0;
      while( true ) {
        iVar4 = Vec_IntSize(pUStack_10->pGia->vCos);
        bVar13 = false;
        if (t < iVar4) {
          _k = Gia_ManCo(pUStack_10->pGia,t);
          bVar13 = _k != (Gia_Obj_t *)0x0;
        }
        pUVar11 = pUnrObj;
        if (!bVar13) break;
        pVVar1 = pUStack_10->vCoMap;
        iVar4 = Gia_ObjId(pUStack_10->pGia,_k);
        iVar4 = Vec_IntEntry((Vec_Int_t *)pUVar11,iVar4);
        Vec_IntPush(pVVar1,iVar4);
        t = t + 1;
      }
      Vec_IntFreeP((Vec_Int_t **)&pUnrObj);
      if (vRoots._4_4_ != 0) {
        Unr_ManProfileRanks(pUStack_10->vRanks);
        printf("Memory usage = %6.2f MB  ",((double)pInts._4_4_ * 4.0) / 1048576.0);
        aVar12 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar12 - aVar9);
      }
      Vec_IntFreeP(&pUStack_10->vOrder);
      Vec_IntFreeP(&pUStack_10->vOrderLim);
      Vec_IntFreeP(&pUStack_10->vRanks);
      Vec_IntFreeP(&pUStack_10->vTents);
      return;
    }
    t = Vec_IntEntry(pUStack_10->vOrderLim,nInts);
    iVar4 = Vec_IntEntry(pUStack_10->vOrderLim,nInts + 1);
    Vec_IntPush(pUStack_10->vObjLim,(int)(clk - (long)pUStack_10->pObjs >> 2));
    for (; t < iVar4; t = t + 1) {
      uVar6 = Vec_IntEntry(pUStack_10->vOrder,t);
      _k = Gia_ManObj(pUStack_10->pGia,uVar6);
      pUVar11 = Unr_ManObj(pUStack_10,(int)(clk - (long)pUStack_10->pObjs >> 2));
      *(ulong *)&pUVar11->field_0x8 =
           *(ulong *)&pUVar11->field_0x8 & 0xffffffff0001ffff | 0xfffe0000;
      *(ulong *)&pUVar11->field_0x8 = *(ulong *)&pUVar11->field_0x8 & 0xfffffffffffe0003 | 0x1fffc;
      iVar5 = Gia_ObjIsAnd(_k);
      if ((iVar5 != 0) || (iVar5 = Gia_ObjIsCo(_k), iVar5 != 0)) {
        iVar5 = Vec_IntEntry(pUStack_10->vTents,uVar6);
        pVVar1 = pUStack_10->vTents;
        iVar7 = Gia_ObjFaninId0(_k,uVar6);
        iVar7 = Vec_IntEntry(pVVar1,iVar7);
        uVar8 = Abc_MaxInt(0,(iVar5 - iVar7) + -1);
        *(ulong *)&pUVar11->field_0x8 =
             *(ulong *)&pUVar11->field_0x8 & 0xfffffffffffe0003 | ((ulong)uVar8 & 0x7fff) << 2;
      }
      iVar5 = Gia_ObjIsAnd(_k);
      if (iVar5 == 0) {
        iVar5 = Gia_ObjIsRo(pUStack_10->pGia,_k);
        if (iVar5 != 0) {
          *(ulong *)&pUVar11->field_0x8 = *(ulong *)&pUVar11->field_0x8 & 0xfffffffffffe0003;
        }
      }
      else {
        iVar5 = Vec_IntEntry(pUStack_10->vTents,uVar6);
        pVVar1 = pUStack_10->vTents;
        iVar7 = Gia_ObjFaninId1(_k,uVar6);
        iVar7 = Vec_IntEntry(pVVar1,iVar7);
        uVar8 = Abc_MaxInt(0,(iVar5 - iVar7) + -1);
        *(ulong *)&pUVar11->field_0x8 =
             *(ulong *)&pUVar11->field_0x8 & 0xffffffff0001ffff | ((ulong)uVar8 & 0x7fff) << 0x11;
      }
      iVar5 = Vec_IntEntry(pUStack_10->vRanks,uVar6);
      *(ulong *)&pUVar11->field_0x8 =
           *(ulong *)&pUVar11->field_0x8 & 0xfffe0003ffffffff |
           ((ulong)(iVar5 + 1) & 0x7fff) << 0x22;
      *(ulong *)&pUVar11->field_0x8 =
           *(ulong *)&pUVar11->field_0x8 & 0x1ffffffffffff | 0xfffe000000000000;
      pUVar11->OrigId = uVar6;
      for (iObj = 0;
          iObj < (int)((uint)((ulong)*(undefined8 *)&pUVar11->field_0x8 >> 0x22) & 0x7fff);
          iObj = iObj + 1) {
        pUVar11->Res[iObj] = 0xffffffff;
      }
      if ((clk - (long)pUStack_10->pObjs >> 2 & 1U) != 0) {
        __assert_fail("((pInts - p->pObjs) & 1) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcUnroll.c"
                      ,0xfe,"void Unr_ManSetup(Unr_Man_t *, int)");
      }
      Vec_IntWriteEntry((Vec_Int_t *)pUnrObj,uVar6,(int)(clk - (long)pUStack_10->pObjs >> 2));
      iVar5 = Unr_ObjSize(pUVar11);
      clk = clk + (long)iVar5 * 4;
    }
    nInts = nInts + -1;
  } while( true );
}

Assistant:

void Unr_ManSetup( Unr_Man_t * p, int fVerbose )
{
    Vec_Int_t * vRoots, * vRoots2, * vMap;
    Unr_Obj_t * pUnrObj;
    Gia_Obj_t * pObj;
    int i, k, t, iObj, nInts, * pInts;
    abctime clk = Abc_Clock();
    // create zero rank
    assert( Vec_IntSize(p->vOrder) == 0 );
    Vec_IntPush( p->vOrder, 0 );
    Vec_IntPush( p->vOrderLim, Vec_IntSize(p->vOrder) );
    Vec_IntWriteEntry( p->vTents, 0, 0 );
    Vec_IntWriteEntry( p->vRanks, 0, 0 );
    // start from the POs
    vRoots  = Vec_IntAlloc( 100 );
    vRoots2 = Vec_IntAlloc( 100 );
    Gia_ManForEachPo( p->pGia, pObj, i )
        Unr_ManSetup_rec( p, Gia_ObjId(p->pGia, pObj), 0, vRoots );
    // collect tents
    while ( Vec_IntSize(vRoots) > 0 )
    {
        Vec_IntPush( p->vOrderLim, Vec_IntSize(p->vOrder) );
        Vec_IntClear( vRoots2 );
        Vec_IntForEachEntry( vRoots, iObj, i )
            Unr_ManSetup_rec( p, iObj, Vec_IntSize(p->vOrderLim)-1, vRoots2 );
        ABC_SWAP( Vec_Int_t *, vRoots, vRoots2 );
    }
    Vec_IntPush( p->vOrderLim, Vec_IntSize(p->vOrder) );
    Vec_IntFree( vRoots );
    Vec_IntFree( vRoots2 );
    // allocate memory
    nInts = 0;
    Vec_IntForEachEntry( p->vOrder, iObj, i )
        nInts += Unr_ObjSizeInt( Vec_IntEntry(p->vRanks, iObj) + 1 );
    p->pObjs = pInts = ABC_CALLOC( int, nInts );
    p->pEnd = p->pObjs + nInts;
    // create const0 node
    pUnrObj = Unr_ManObj( p, pInts - p->pObjs );
    pUnrObj->RankMax = Vec_IntEntry(p->vRanks, 0) + 1;
    pUnrObj->uRDiff0 = pUnrObj->uRDiff1 = UNR_DIFF_NULL;
    pUnrObj->Res[0]  = 0; // const0
    // map the objects
    vMap = Vec_IntStartFull( p->nObjs );
    Vec_IntWriteEntry( vMap, 0, pInts - p->pObjs );
    pInts += Unr_ObjSize(pUnrObj);
    // mark up the entries
    assert( Vec_IntSize(p->vObjLim) == 0 );
    for ( t = Vec_IntSize(p->vOrderLim) - 2; t >= 0; t-- )
    {
        int Beg = Vec_IntEntry(p->vOrderLim, t);
        int End = Vec_IntEntry(p->vOrderLim, t+1);
        Vec_IntPush( p->vObjLim, pInts - p->pObjs );
        Vec_IntForEachEntryStartStop( p->vOrder, iObj, i, Beg, End )
        {
            pObj = Gia_ManObj( p->pGia, iObj );
            pUnrObj = Unr_ManObj( p, pInts - p->pObjs );
            pUnrObj->uRDiff0 = pUnrObj->uRDiff1 = UNR_DIFF_NULL;
            if ( Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) )
                pUnrObj->uRDiff0 = Abc_MaxInt(0, Vec_IntEntry(p->vTents, iObj) - Vec_IntEntry(p->vTents, Gia_ObjFaninId0(pObj, iObj)) - 1);
            if ( Gia_ObjIsAnd(pObj) )
                pUnrObj->uRDiff1 = Abc_MaxInt(0, Vec_IntEntry(p->vTents, iObj) - Vec_IntEntry(p->vTents, Gia_ObjFaninId1(pObj, iObj)) - 1);
            else if ( Gia_ObjIsRo(p->pGia, pObj) )
                pUnrObj->uRDiff0 = 0;
            pUnrObj->RankMax = Vec_IntEntry(p->vRanks, iObj) + 1;
            pUnrObj->RankCur = UNR_DIFF_NULL;
            pUnrObj->OrigId  = iObj;
            for ( k = 0; k < (int)pUnrObj->RankMax; k++ )
                pUnrObj->Res[k] = -1;
            assert( ((pInts - p->pObjs) & 1) == 0 ); // align for 64-bits
            Vec_IntWriteEntry( vMap, iObj, pInts - p->pObjs );
            pInts += Unr_ObjSize( pUnrObj );
        }
    }
    assert( pInts - p->pObjs == nInts );
    // label the objects
    Gia_ManForEachObj( p->pGia, pObj, i )
    {
        if ( Vec_IntEntry(vMap, i) == -1 )
            continue;
        pUnrObj = Unr_ManObj( p, Vec_IntEntry(vMap, i) );
        if ( Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) )
        {
            pUnrObj->hFan0   = Vec_IntEntry( vMap, Gia_ObjFaninId0(pObj, i) );
            pUnrObj->fCompl0 = Gia_ObjFaninC0(pObj);
            pUnrObj->fItIsPo = Gia_ObjIsPo(p->pGia, pObj);
        }
        if ( Gia_ObjIsAnd(pObj) )
        {
            pUnrObj->hFan1   = Vec_IntEntry( vMap, Gia_ObjFaninId1(pObj, i) );
            pUnrObj->fCompl1 = Gia_ObjFaninC1(pObj);
        }
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            pUnrObj->hFan0   = Vec_IntEntry( vMap, Gia_ObjId(p->pGia, Gia_ObjRoToRi(p->pGia, pObj)) );
            pUnrObj->fCompl0 = 0;
        }
        else if ( Gia_ObjIsPi(p->pGia, pObj) )
        {
            pUnrObj->hFan0   = Gia_ObjCioId(pObj);           // remember CIO id
            pUnrObj->hFan1   = Vec_IntEntry(p->vTents, i);   // remember tent
            pUnrObj->fItIsPi = 1;
        }
    }
    // store CI/PO objects;
    Gia_ManForEachCi( p->pGia, pObj, i )
        Vec_IntPush( p->vCiMap, Vec_IntEntry(vMap, Gia_ObjId(p->pGia, pObj)) );
    Gia_ManForEachCo( p->pGia, pObj, i )
        Vec_IntPush( p->vCoMap, Vec_IntEntry(vMap, Gia_ObjId(p->pGia, pObj)) );
    Vec_IntFreeP( &vMap );
    // print stats
    if ( fVerbose )
    {
        Unr_ManProfileRanks( p->vRanks );
        printf( "Memory usage = %6.2f MB  ", 4.0 * nInts / (1<<20) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    Vec_IntFreeP( &p->vOrder );
    Vec_IntFreeP( &p->vOrderLim );
    Vec_IntFreeP( &p->vRanks );
    Vec_IntFreeP( &p->vTents );
}